

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O1

void FAudio_INTERNAL_MixCallback(void *userdata,Uint8 *stream,int len)

{
  SDL_memset(stream,0,(long)len);
  if (*(char *)((long)userdata + 1) != '\0') {
    FAudio_INTERNAL_UpdateEngine((FAudio *)userdata,(float *)stream);
    return;
  }
  return;
}

Assistant:

static void FAudio_INTERNAL_MixCallback(void *userdata, Uint8 *stream, int len)
{
	FAudio *audio = (FAudio*) userdata;

	FAudio_zero(stream, len);
	if (audio->active)
	{
		FAudio_INTERNAL_UpdateEngine(
			audio,
			(float*) stream
		);
	}
}